

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_copySequencesToSeqStoreNoBlockDelim
                 (ZSTD_CCtx *cctx,ZSTD_sequencePosition *seqPos,ZSTD_Sequence *inSeqs,
                 size_t inSeqsSize,void *src,size_t blockSize,ZSTD_paramSwitch_e externalRepSearch)

{
  undefined4 uVar1;
  undefined8 uVar2;
  long lVar3;
  uint uVar4;
  U32 UVar5;
  uint uVar6;
  ulong uVar7;
  undefined8 *puVar8;
  long lVar9;
  ulong uVar10;
  void *pvVar11;
  ulong in_RCX;
  long in_RDX;
  void *dst;
  uint *in_RSI;
  long in_RDI;
  ulong uVar12;
  void *in_R8;
  long *plVar13;
  ulong in_R9;
  U32 lastLLSize;
  size_t err_code;
  U32 ll0;
  U32 secondHalfMatchLength;
  U32 firstHalfMatchLength;
  U32 offBase;
  U32 rawOffset;
  U32 matchLength;
  U32 litLength;
  ZSTD_Sequence currSeq;
  U32 finalMatchSplit;
  U32 bytesAdjustment;
  repcodes_t updatedRepcodes;
  BYTE *iend;
  BYTE *ip;
  size_t dictSize;
  U32 endPosInSequence;
  U32 startPosInSequence;
  U32 idx;
  size_t mlBase;
  BYTE *litEnd;
  BYTE *litLimit_w;
  BYTE *oend;
  BYTE *op;
  BYTE *ip_1;
  ptrdiff_t diff;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffec0;
  U32 in_stack_fffffffffffffec4;
  uint in_stack_fffffffffffffec8;
  U32 in_stack_fffffffffffffecc;
  U32 *in_stack_fffffffffffffed0;
  uint local_120;
  U32 UVar14;
  uint local_110;
  U32 windowLog;
  uint uVar15;
  U32 minMatch;
  uint matchLength_00;
  undefined8 uVar16;
  uint local_cc;
  uint local_c8;
  uint local_c4;
  void *local_38;
  void *local_30;
  
  local_c4 = *in_RSI;
  local_c8 = in_RSI[1];
  local_cc = in_RSI[1] + (int)in_R9;
  uVar7 = (long)in_R8 + in_R9;
  matchLength_00 = 0;
  minMatch = 0;
  uVar16 = *(undefined8 *)(*(long *)(in_RDI + 0xc68) + 0x15f0);
  uVar1 = *(undefined4 *)(*(long *)(in_RDI + 0xc68) + 0x15f8);
  do {
    uVar6 = in_stack_fffffffffffffec8 & 0xffffff;
    if ((local_cc != 0) && (uVar6 = in_stack_fffffffffffffec8 & 0xffffff, local_c4 < in_RCX)) {
      uVar6 = CONCAT13(minMatch != 0,(int3)in_stack_fffffffffffffec8) ^ 0xff000000;
    }
    in_stack_fffffffffffffec8 = uVar6;
    if ((in_stack_fffffffffffffec8 & 0x1000000) == 0) goto LAB_002421e4;
    puVar8 = (undefined8 *)(in_RDX + (ulong)local_c4 * 0x10);
    uVar2 = *puVar8;
    UVar14 = (U32)uVar2;
    uVar6 = (uint)((ulong)uVar2 >> 0x20);
    uVar10 = puVar8[1];
    uVar15 = (uint)uVar10;
    if (local_cc < uVar6 + uVar15) {
      if (local_cc <= uVar6) {
LAB_002421e4:
        if ((local_c4 != in_RCX) &&
           ((uint)(*(int *)(in_RDX + (ulong)local_c4 * 0x10 + 4) +
                  *(int *)(in_RDX + (ulong)local_c4 * 0x10 + 8)) < local_cc)) {
          __assert_fail("idx == inSeqsSize || endPosInSequence <= inSeqs[idx].litLength + inSeqs[idx].matchLength"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x6a70,
                        "size_t ZSTD_copySequencesToSeqStoreNoBlockDelim(ZSTD_CCtx *, ZSTD_sequencePosition *, const ZSTD_Sequence *const, size_t, const void *, size_t, ZSTD_paramSwitch_e)"
                       );
        }
        *in_RSI = local_c4;
        in_RSI[1] = local_cc;
        lVar3 = *(long *)(in_RDI + 0xc70);
        *(undefined8 *)(lVar3 + 0x15f0) = uVar16;
        *(undefined4 *)(lVar3 + 0x15f8) = uVar1;
        pvVar11 = (void *)(uVar7 - matchLength_00);
        if (in_R8 != pvVar11) {
          uVar6 = (int)pvVar11 - (int)in_R8;
          if (pvVar11 < in_R8) {
            __assert_fail("ip <= iend",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x6a79,
                          "size_t ZSTD_copySequencesToSeqStoreNoBlockDelim(ZSTD_CCtx *, ZSTD_sequencePosition *, const ZSTD_Sequence *const, size_t, const void *, size_t, ZSTD_paramSwitch_e)"
                         );
          }
          ZSTD_storeLastLiterals
                    ((seqStore_t *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                     (BYTE *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),0x242318)
          ;
          *(ulong *)(in_RSI + 2) = (ulong)uVar6 + *(long *)(in_RSI + 2);
        }
        return (ulong)matchLength_00;
      }
      if (local_c8 < uVar6) {
        in_stack_fffffffffffffec4 = uVar6 - local_c8;
      }
      else {
        in_stack_fffffffffffffec4 = 0;
      }
      local_120 = (local_cc - local_c8) - in_stack_fffffffffffffec4;
      if (((uVar10 & 0xffffffff) <= in_R9) || (local_120 < *(uint *)(in_RDI + 0xf4))) {
        matchLength_00 = local_cc - uVar6;
        local_cc = uVar6;
        goto LAB_002421e4;
      }
      uVar4 = (uVar15 + uVar6) - local_cc;
      if (uVar4 < *(uint *)(in_RDI + 0xf4)) {
        local_cc = local_cc - (*(int *)(in_RDI + 0xf4) - uVar4);
        matchLength_00 = *(int *)(in_RDI + 0xf4) - uVar4;
        local_120 = local_120 - matchLength_00;
      }
      minMatch = 1;
      local_110 = in_stack_fffffffffffffec4;
    }
    else {
      if (local_c8 < uVar6) {
        local_110 = uVar6 - local_c8;
        local_120 = uVar15;
      }
      else {
        local_110 = 0;
        local_120 = uVar15 - (local_c8 - uVar6);
      }
      local_cc = local_cc - (uVar6 + uVar15);
      local_c8 = 0;
    }
    windowLog = UVar14;
    UVar5 = ZSTD_finalizeOffBase
                      (in_stack_fffffffffffffec4,
                       (U32 *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),0);
    ZSTD_updateRep(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,in_stack_fffffffffffffec8);
    if (*(int *)(in_RDI + 0x168) != 0) {
      *(ulong *)(in_RSI + 2) = (ulong)(local_110 + local_120) + *(long *)(in_RSI + 2);
      in_stack_fffffffffffffeb8 = *(undefined4 *)(in_RDI + 0x198);
      in_stack_fffffffffffffed0 =
           (U32 *)ZSTD_validateSequence
                            ((U32)uVar16,matchLength_00,minMatch,CONCAT44(uVar15,uVar6),windowLog,
                             CONCAT44(local_120,UVar14),(int)in_R8);
      uVar6 = ERR_isError((size_t)in_stack_fffffffffffffed0);
      if (uVar6 != 0) {
        return (size_t)in_stack_fffffffffffffed0;
      }
    }
    if (*(ulong *)(in_RDI + 0x3d8) <= (ulong)(local_c4 - *in_RSI)) {
      return 0xffffffffffffff95;
    }
    plVar13 = (long *)(in_RDI + 0x3a0);
    uVar12 = (ulong)local_110;
    uVar10 = (ulong)local_120;
    if (*(ulong *)(in_RDI + 0x3d8) <= (ulong)(*(long *)(in_RDI + 0x3a8) - *plVar13 >> 3)) {
      __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468b,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0x20000 < *(ulong *)(in_RDI + 0x3e0)) {
      __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468d,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if ((ulong)(*(long *)(in_RDI + 0x3b0) + *(long *)(in_RDI + 0x3e0)) <
        *(long *)(in_RDI + 0x3b8) + uVar12) {
      __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468e,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (uVar7 < (long)in_R8 + uVar12) {
      __assert_fail("literals + litLength <= litLimit",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468f,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (uVar7 - 0x20 < (long)in_R8 + uVar12) {
      ZSTD_safecopyLiterals
                ((BYTE *)in_stack_fffffffffffffed0,
                 (BYTE *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                 (BYTE *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                 (BYTE *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      pvVar11 = in_R8;
    }
    else {
      pvVar11 = in_R8;
      ZSTD_copy16(*(void **)(in_RDI + 0x3b8),in_R8);
      if (0x10 < uVar12) {
        lVar3 = *(long *)(in_RDI + 0x3b8);
        dst = (void *)(lVar3 + 0x10);
        lVar9 = (long)dst - ((long)in_R8 + 0x10);
        if ((lVar9 < 0x10) && (-0x10 < lVar9)) {
          __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x36a6,
                        "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)")
          ;
        }
        ZSTD_copy16(dst,(void *)((long)in_R8 + 0x10));
        if (0x10 < (long)(uVar12 - 0x10)) {
          local_38 = (void *)(lVar3 + 0x20);
          do {
            local_30 = (void *)((long)in_R8 + 0x20);
            ZSTD_copy16(local_38,local_30);
            ZSTD_copy16((void *)((long)local_38 + 0x10),(void *)((long)in_R8 + 0x30));
            local_38 = (void *)((long)local_38 + 0x20);
            in_R8 = local_30;
          } while (local_38 < (void *)((long)dst + (uVar12 - 0x10)));
        }
      }
    }
    *(ulong *)(in_RDI + 0x3b8) = uVar12 + *(long *)(in_RDI + 0x3b8);
    if (0xffff < uVar12) {
      if (*(int *)(in_RDI + 1000) != 0) {
        __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x46a0,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      *(undefined4 *)(in_RDI + 1000) = 1;
      *(int *)(in_RDI + 0x3ec) = (int)(*(long *)(in_RDI + 0x3a8) - *plVar13 >> 3);
    }
    *(short *)(*(long *)(in_RDI + 0x3a8) + 4) = (short)local_110;
    **(U32 **)(in_RDI + 0x3a8) = UVar5;
    if (uVar10 < 3) {
      __assert_fail("matchLength >= MINMATCH",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x46aa,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    uVar10 = uVar10 - 3;
    if (0xffff < uVar10) {
      if (*(int *)(in_RDI + 1000) != 0) {
        __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x46ad,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      *(undefined4 *)(in_RDI + 1000) = 2;
      *(int *)(in_RDI + 0x3ec) = (int)(*(long *)(in_RDI + 0x3a8) - *plVar13 >> 3);
    }
    *(short *)(*(long *)(in_RDI + 0x3a8) + 6) = (short)uVar10;
    *(long *)(in_RDI + 0x3a8) = *(long *)(in_RDI + 0x3a8) + 8;
    in_R8 = (void *)((long)pvVar11 + (ulong)(local_120 + local_110));
    if (minMatch == 0) {
      local_c4 = local_c4 + 1;
    }
  } while( true );
}

Assistant:

size_t
ZSTD_copySequencesToSeqStoreNoBlockDelim(ZSTD_CCtx* cctx, ZSTD_sequencePosition* seqPos,
                                   const ZSTD_Sequence* const inSeqs, size_t inSeqsSize,
                                   const void* src, size_t blockSize, ZSTD_paramSwitch_e externalRepSearch)
{
    U32 idx = seqPos->idx;
    U32 startPosInSequence = seqPos->posInSequence;
    U32 endPosInSequence = seqPos->posInSequence + (U32)blockSize;
    size_t dictSize;
    BYTE const* ip = (BYTE const*)(src);
    BYTE const* iend = ip + blockSize;  /* May be adjusted if we decide to process fewer than blockSize bytes */
    repcodes_t updatedRepcodes;
    U32 bytesAdjustment = 0;
    U32 finalMatchSplit = 0;

    /* TODO(embg) support fast parsing mode in noBlockDelim mode */
    (void)externalRepSearch;

    if (cctx->cdict) {
        dictSize = cctx->cdict->dictContentSize;
    } else if (cctx->prefixDict.dict) {
        dictSize = cctx->prefixDict.dictSize;
    } else {
        dictSize = 0;
    }
    DEBUGLOG(5, "ZSTD_copySequencesToSeqStoreNoBlockDelim: idx: %u PIS: %u blockSize: %zu", idx, startPosInSequence, blockSize);
    DEBUGLOG(5, "Start seq: idx: %u (of: %u ml: %u ll: %u)", idx, inSeqs[idx].offset, inSeqs[idx].matchLength, inSeqs[idx].litLength);
    ZSTD_memcpy(updatedRepcodes.rep, cctx->blockState.prevCBlock->rep, sizeof(repcodes_t));
    while (endPosInSequence && idx < inSeqsSize && !finalMatchSplit) {
        const ZSTD_Sequence currSeq = inSeqs[idx];
        U32 litLength = currSeq.litLength;
        U32 matchLength = currSeq.matchLength;
        U32 const rawOffset = currSeq.offset;
        U32 offBase;

        /* Modify the sequence depending on where endPosInSequence lies */
        if (endPosInSequence >= currSeq.litLength + currSeq.matchLength) {
            if (startPosInSequence >= litLength) {
                startPosInSequence -= litLength;
                litLength = 0;
                matchLength -= startPosInSequence;
            } else {
                litLength -= startPosInSequence;
            }
            /* Move to the next sequence */
            endPosInSequence -= currSeq.litLength + currSeq.matchLength;
            startPosInSequence = 0;
        } else {
            /* This is the final (partial) sequence we're adding from inSeqs, and endPosInSequence
               does not reach the end of the match. So, we have to split the sequence */
            DEBUGLOG(6, "Require a split: diff: %u, idx: %u PIS: %u",
                     currSeq.litLength + currSeq.matchLength - endPosInSequence, idx, endPosInSequence);
            if (endPosInSequence > litLength) {
                U32 firstHalfMatchLength;
                litLength = startPosInSequence >= litLength ? 0 : litLength - startPosInSequence;
                firstHalfMatchLength = endPosInSequence - startPosInSequence - litLength;
                if (matchLength > blockSize && firstHalfMatchLength >= cctx->appliedParams.cParams.minMatch) {
                    /* Only ever split the match if it is larger than the block size */
                    U32 secondHalfMatchLength = currSeq.matchLength + currSeq.litLength - endPosInSequence;
                    if (secondHalfMatchLength < cctx->appliedParams.cParams.minMatch) {
                        /* Move the endPosInSequence backward so that it creates match of minMatch length */
                        endPosInSequence -= cctx->appliedParams.cParams.minMatch - secondHalfMatchLength;
                        bytesAdjustment = cctx->appliedParams.cParams.minMatch - secondHalfMatchLength;
                        firstHalfMatchLength -= bytesAdjustment;
                    }
                    matchLength = firstHalfMatchLength;
                    /* Flag that we split the last match - after storing the sequence, exit the loop,
                       but keep the value of endPosInSequence */
                    finalMatchSplit = 1;
                } else {
                    /* Move the position in sequence backwards so that we don't split match, and break to store
                     * the last literals. We use the original currSeq.litLength as a marker for where endPosInSequence
                     * should go. We prefer to do this whenever it is not necessary to split the match, or if doing so
                     * would cause the first half of the match to be too small
                     */
                    bytesAdjustment = endPosInSequence - currSeq.litLength;
                    endPosInSequence = currSeq.litLength;
                    break;
                }
            } else {
                /* This sequence ends inside the literals, break to store the last literals */
                break;
            }
        }
        /* Check if this offset can be represented with a repcode */
        {   U32 const ll0 = (litLength == 0);
            offBase = ZSTD_finalizeOffBase(rawOffset, updatedRepcodes.rep, ll0);
            ZSTD_updateRep(updatedRepcodes.rep, offBase, ll0);
        }

        if (cctx->appliedParams.validateSequences) {
            seqPos->posInSrc += litLength + matchLength;
            FORWARD_IF_ERROR(ZSTD_validateSequence(offBase, matchLength, cctx->appliedParams.cParams.minMatch, seqPos->posInSrc,
                                                   cctx->appliedParams.cParams.windowLog, dictSize, cctx->appliedParams.useSequenceProducer),
                                                   "Sequence validation failed");
        }
        DEBUGLOG(6, "Storing sequence: (of: %u, ml: %u, ll: %u)", offBase, matchLength, litLength);
        RETURN_ERROR_IF(idx - seqPos->idx >= cctx->seqStore.maxNbSeq, externalSequences_invalid,
                        "Not enough memory allocated. Try adjusting ZSTD_c_minMatch.");
        ZSTD_storeSeq(&cctx->seqStore, litLength, ip, iend, offBase, matchLength);
        ip += matchLength + litLength;
        if (!finalMatchSplit)
            idx++; /* Next Sequence */
    }
    DEBUGLOG(5, "Ending seq: idx: %u (of: %u ml: %u ll: %u)", idx, inSeqs[idx].offset, inSeqs[idx].matchLength, inSeqs[idx].litLength);
    assert(idx == inSeqsSize || endPosInSequence <= inSeqs[idx].litLength + inSeqs[idx].matchLength);
    seqPos->idx = idx;
    seqPos->posInSequence = endPosInSequence;
    ZSTD_memcpy(cctx->blockState.nextCBlock->rep, updatedRepcodes.rep, sizeof(repcodes_t));

    iend -= bytesAdjustment;
    if (ip != iend) {
        /* Store any last literals */
        U32 lastLLSize = (U32)(iend - ip);
        assert(ip <= iend);
        DEBUGLOG(6, "Storing last literals of size: %u", lastLLSize);
        ZSTD_storeLastLiterals(&cctx->seqStore, ip, lastLLSize);
        seqPos->posInSrc += lastLLSize;
    }

    return bytesAdjustment;
}